

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

int __thiscall lzham::lzham_decompressor::init(lzham_decompressor *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  
  CLZDecompBase::init_position_slots(&this->m_lzBase,(this->m_params).m_dict_size_log2);
  this->m_state = 0;
  this->m_step = 0;
  this->m_block_step = 0;
  this->m_block_index = 0;
  this->m_initial_step = 0;
  this->m_dst_ofs = 0;
  this->m_dst_highwater_ofs = 0;
  this->m_pIn_buf = (uint8 *)0x0;
  this->m_pIn_buf_size = (size_t *)0x0;
  this->m_pOut_buf = (uint8 *)0x0;
  this->m_pOut_buf_size = (size_t *)0x0;
  this->m_no_more_input_bytes_flag = false;
  this->m_status = LZHAM_DECOMP_STATUS_NOT_FINISHED;
  this->m_pOrig_out_buf = (uint8 *)0x0;
  this->m_orig_out_buf_size = 0;
  this->m_decomp_adler32 = 1;
  this->m_seed_bytes_to_ignore_when_flushing = 0;
  this->m_z_last_status = LZHAM_DECOMP_STATUS_NOT_FINISHED;
  this->m_z_first_call = 1;
  this->m_z_has_flushed = 0;
  this->m_z_cmf = 0;
  this->m_z_flg = 0;
  this->m_z_dict_adler32 = 0;
  this->m_tmp = 0;
  this->m_match_hist0 = 0;
  this->m_match_hist1 = 0;
  this->m_match_hist2 = 0;
  this->m_match_hist3 = 0;
  this->m_cur_state = 0;
  this->m_start_block_dst_ofs = 0;
  this->m_block_type = 0;
  this->m_flush_num_bytes_remaining = 0;
  this->m_flush_n = 0;
  this->m_file_src_file_adler32 = 0;
  this->m_rep_lit0 = 0;
  this->m_match_len = 0;
  this->m_match_slot = 0;
  this->m_extra_bits = 0;
  this->m_num_extra_bits = 0;
  this->m_src_ofs = 0;
  this->m_pCopy_src = (uint8 *)0x0;
  this->m_num_raw_bytes_remaining = 0;
  symbol_codec::clear((symbol_codec *)this);
  return extraout_EAX;
}

Assistant:

void lzham_decompressor::init()
   {
      m_lzBase.init_position_slots(m_params.m_dict_size_log2);

#ifdef LZHAM_LZDEBUG
      if (m_pDecomp_buf)
         memset(m_pDecomp_buf, 0xCE, 1U << m_params.m_dict_size_log2);
#endif

      m_state = LZHAM_CR_INITIAL_STATE;
      m_step = 0;
      m_block_step = 0;
      m_block_index = 0;
      m_initial_step = 0;
            
      m_dst_ofs = 0;
      m_dst_highwater_ofs = 0;

      m_pIn_buf = NULL;
      m_pIn_buf_size = NULL;
      m_pOut_buf = NULL;
      m_pOut_buf_size = NULL;
      m_no_more_input_bytes_flag = false;
      m_status = LZHAM_DECOMP_STATUS_NOT_FINISHED;
      m_pOrig_out_buf = NULL;
      m_orig_out_buf_size = 0;
      m_decomp_adler32 = cInitAdler32;
      m_seed_bytes_to_ignore_when_flushing = 0;
      
      m_z_last_status = LZHAM_DECOMP_STATUS_NOT_FINISHED;
      m_z_first_call = 1;
      m_z_has_flushed = 0;
      m_z_cmf = 0;
      m_z_flg = 0;
      m_z_dict_adler32 = 0;

      m_tmp = 0;

      m_match_hist0 = 0;
      m_match_hist1 = 0;
      m_match_hist2 = 0;
      m_match_hist3 = 0;
      m_cur_state = 0;
      
      m_start_block_dst_ofs = 0;
      m_block_type = 0;
      m_flush_num_bytes_remaining = 0;
      m_flush_n = 0;
      m_file_src_file_adler32 = 0;
      m_rep_lit0 = 0;
      m_match_len = 0;
      m_match_slot = 0;
      m_extra_bits = 0;
      m_num_extra_bits = 0;
      m_src_ofs = 0;
      m_pCopy_src = NULL;
      m_num_raw_bytes_remaining = 0;
      
      m_codec.clear();
   }